

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O3

uint64_t blech32_polymod_step(uint64_t pre)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar5;
  int iVar6;
  undefined1 auVar4 [16];
  
  uVar1 = (uint)(pre >> 0x37);
  iVar3 = -(uint)((uVar1 & 2) == 0);
  iVar5 = -(uint)((uVar1 & 4) == 0);
  iVar6 = -(uint)((uVar1 & 8) == 0);
  auVar4._12_4_ = -(uint)((uVar1 & 0x10) == 0);
  auVar2._4_4_ = iVar3;
  auVar2._0_4_ = iVar3;
  auVar2._8_4_ = iVar5;
  auVar2._12_4_ = iVar5;
  auVar4._4_4_ = iVar6;
  auVar4._0_4_ = iVar6;
  auVar4._8_4_ = auVar4._12_4_;
  auVar2 = ~auVar2 & _DAT_00152450 ^ ~auVar4 & _DAT_00152440;
  return auVar2._8_8_ ^ auVar2._0_8_ ^
         (long)(pre << 8) >> 0x3f & 0x7d52fba40bd886U ^ (pre & 0x7fffffffffffff) << 5;
}

Assistant:

static uint64_t blech32_polymod_step(uint64_t pre) {
    uint8_t b = pre >> 55;
    return ((pre & 0x7fffffffffffffULL) << 5) ^
           (-((b >> 0) & 1) & 0x7d52fba40bd886ULL) ^
           (-((b >> 1) & 1) & 0x5e8dbf1a03950cULL) ^
           (-((b >> 2) & 1) & 0x1c3a3c74072a18ULL) ^
           (-((b >> 3) & 1) & 0x385d72fa0e5139ULL) ^
           (-((b >> 4) & 1) & 0x7093e5a608865bULL);
}